

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

pid_t testing::internal::ExecDeathTestSpawnChild(char **argv,int close_fd)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int gtest_retval_1;
  void *stack_top;
  size_t kMaxStackAlignment;
  void *stack;
  size_t stack_size;
  bool use_fork;
  int gtest_retval;
  sigaction ignore_sigprof_action;
  sigaction saved_sigprof_action;
  pid_t child_pid;
  ExecDeathTestArgs args;
  char *in_stack_fffffffffffff840;
  allocator<char> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff848;
  undefined7 in_stack_fffffffffffff850;
  undefined1 in_stack_fffffffffffff857;
  undefined1 uVar4;
  undefined7 in_stack_fffffffffffff868;
  undefined1 in_stack_fffffffffffff86f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff880;
  string local_768 [39];
  allocator<char> local_741;
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [36];
  undefined4 local_67c;
  string local_678 [39];
  undefined1 local_651 [33];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [32];
  int local_570;
  undefined4 local_56c;
  string local_568 [39];
  allocator<char> local_541;
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [8];
  void *in_stack_fffffffffffffb28;
  string local_4c0 [32];
  string local_4a0 [36];
  undefined4 local_47c;
  string local_478 [39];
  allocator<char> local_451;
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  _Alloc_hider *local_390;
  undefined8 local_388;
  undefined4 local_37c;
  string local_378 [39];
  undefined1 local_351 [33];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  size_t local_288;
  byte local_27d;
  undefined4 local_27c;
  string local_278 [55];
  allocator<char> local_241;
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [36];
  int local_15c;
  _union_1457 local_158;
  sigset_t sStack_150;
  sigaction local_c0;
  int local_24;
  undefined1 local_20 [32];
  
  local_24 = -1;
  memset(&local_158,0,0x98);
  sigemptyset(&sStack_150);
  local_158 = (_union_1457)0x1;
  do {
    do {
      local_15c = sigaction(0x1b,(sigaction *)&local_158,&local_c0);
      bVar3 = false;
      if (local_15c == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (local_15c == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff880,(char *)in_stack_fffffffffffff878,
                 (allocator<char> *)in_stack_fffffffffffff870);
      std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      local_27c = 0x1d76;
      StreamableToString<int>((int *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
      std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
      std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      DeathTestAbort((string *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string(local_1c0);
      std::__cxx11::string::~string(local_1e0);
      std::__cxx11::string::~string(local_278);
      std::__cxx11::string::~string(local_200);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::string::~string(local_240);
      std::allocator<char>::~allocator(&local_241);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  local_27d = FLAGS_gtest_death_test_use_fork & 1;
  if (local_27d == 0) {
    if ((ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') &&
       (iVar1 = __cxa_guard_acquire(&ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down),
       iVar1 != 0)) {
      ExecDeathTestSpawnChild::stack_grows_down = StackGrowsDown();
      __cxa_guard_release(&ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down);
    }
    iVar1 = getpagesize();
    local_288 = (size_t)iVar1;
    local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                mmap((void *)0x0,local_288,3,0x22,-1,0);
    do {
      bVar3 = IsTrue(local_290 !=
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     0xffffffffffffffff);
      if (!bVar3) {
        in_stack_fffffffffffff880 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_351;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff880,(char *)in_stack_fffffffffffff878,
                   (allocator<char> *)in_stack_fffffffffffff870);
        std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        local_37c = 0x1d82;
        StreamableToString<int>
                  ((int *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
        std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
        std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        DeathTestAbort((string *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
        std::__cxx11::string::~string(local_2b0);
        std::__cxx11::string::~string(local_2d0);
        std::__cxx11::string::~string(local_2f0);
        std::__cxx11::string::~string(local_378);
        std::__cxx11::string::~string(local_310);
        std::__cxx11::string::~string(local_330);
        std::__cxx11::string::~string((string *)(local_351 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_351);
      }
      bVar3 = AlwaysFalse();
    } while (bVar3);
    local_388 = 0x40;
    if ((ExecDeathTestSpawnChild::stack_grows_down & 1U) == 0) {
      in_stack_fffffffffffff870 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      in_stack_fffffffffffff870 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_288 - 0x40);
    }
    local_390 = &in_stack_fffffffffffff870->_M_dataplus + (long)&local_290->_M_dataplus;
    in_stack_fffffffffffff878 = local_290;
    do {
      in_stack_fffffffffffff86f = 0x40 < local_288 && ((ulong)local_390 & 0x3f) == 0;
      bVar3 = IsTrue((bool)in_stack_fffffffffffff86f);
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff880,(char *)in_stack_fffffffffffff878,
                   (allocator<char> *)in_stack_fffffffffffff870);
        std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        local_47c = 0x1d8f;
        StreamableToString<int>
                  ((int *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
        std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
        std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        DeathTestAbort((string *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
        std::__cxx11::string::~string(local_3b0);
        std::__cxx11::string::~string(local_3d0);
        std::__cxx11::string::~string(local_3f0);
        std::__cxx11::string::~string(local_478);
        std::__cxx11::string::~string(local_410);
        std::__cxx11::string::~string(local_430);
        std::__cxx11::string::~string(local_450);
        std::allocator<char>::~allocator(&local_451);
      }
      bVar3 = AlwaysFalse();
    } while (bVar3);
    local_24 = clone(ExecDeathTestChildMain,local_390,0x11,local_20);
    do {
      iVar1 = munmap(local_290,local_288);
      bVar3 = IsTrue(iVar1 != -1);
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff880,(char *)in_stack_fffffffffffff878,
                   (allocator<char> *)in_stack_fffffffffffff870);
        std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        local_56c = 0x1d93;
        StreamableToString<int>
                  ((int *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
        std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
        std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        DeathTestAbort((string *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
        std::__cxx11::string::~string(local_4a0);
        std::__cxx11::string::~string(local_4c0);
        std::__cxx11::string::~string(local_4e0);
        std::__cxx11::string::~string(local_568);
        std::__cxx11::string::~string(local_500);
        std::__cxx11::string::~string(local_520);
        std::__cxx11::string::~string(local_540);
        std::allocator<char>::~allocator(&local_541);
      }
      bVar3 = AlwaysFalse();
    } while (bVar3);
  }
  if (((local_27d & 1) != 0) && (local_24 = fork(), local_24 == 0)) {
    ExecDeathTestChildMain(in_stack_fffffffffffffb28);
    _exit(0);
  }
  do {
    do {
      local_570 = sigaction(0x1b,&local_c0,(sigaction *)0x0);
      uVar4 = false;
      if (local_570 == -1) {
        piVar2 = __errno_location();
        uVar4 = *piVar2 == 4;
      }
    } while ((bool)uVar4 != false);
    if (local_570 == -1) {
      in_stack_fffffffffffff848 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_651;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff880,(char *)in_stack_fffffffffffff878,
                 (allocator<char> *)in_stack_fffffffffffff870);
      std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      local_67c = 0x1da0;
      StreamableToString<int>((int *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
      std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
      std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      DeathTestAbort((string *)CONCAT17(uVar4,in_stack_fffffffffffff850));
      std::__cxx11::string::~string(local_590);
      std::__cxx11::string::~string(local_5b0);
      std::__cxx11::string::~string(local_5d0);
      std::__cxx11::string::~string(local_5f0);
      std::__cxx11::string::~string(local_678);
      std::__cxx11::string::~string(local_610);
      std::__cxx11::string::~string(local_630);
      std::__cxx11::string::~string((string *)(local_651 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_651);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  do {
    bVar3 = IsTrue(local_24 != -1);
    if (!bVar3) {
      __rhs = &local_741;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff880,(char *)in_stack_fffffffffffff878,
                 (allocator<char> *)in_stack_fffffffffffff870);
      std::operator+(in_stack_fffffffffffff848,(char *)__rhs);
      std::operator+(in_stack_fffffffffffff848,(char *)__rhs);
      StreamableToString<int>((int *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
      std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
      std::operator+(in_stack_fffffffffffff848,(char *)__rhs);
      std::operator+(in_stack_fffffffffffff848,(char *)__rhs);
      DeathTestAbort((string *)CONCAT17(uVar4,in_stack_fffffffffffff850));
      std::__cxx11::string::~string(local_6a0);
      std::__cxx11::string::~string(local_6c0);
      std::__cxx11::string::~string(local_6e0);
      std::__cxx11::string::~string(local_768);
      std::__cxx11::string::~string(local_700);
      std::__cxx11::string::~string(local_720);
      std::__cxx11::string::~string(local_740);
      std::allocator<char>::~allocator(&local_741);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  return local_24;
}

Assistant:

static pid_t ExecDeathTestSpawnChild(char* const* argv, int close_fd) {
  ExecDeathTestArgs args = { argv, close_fd };
  pid_t child_pid = -1;

#  if GTEST_OS_QNX
  // Obtains the current directory and sets it to be closed in the child
  // process.
  const int cwd_fd = open(".", O_RDONLY);
  GTEST_DEATH_TEST_CHECK_(cwd_fd != -1);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(fcntl(cwd_fd, F_SETFD, FD_CLOEXEC));
  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
                   GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  int fd_flags;
  // Set close_fd to be closed after spawn.
  GTEST_DEATH_TEST_CHECK_SYSCALL_(fd_flags = fcntl(close_fd, F_GETFD));
  GTEST_DEATH_TEST_CHECK_SYSCALL_(fcntl(close_fd, F_SETFD,
                                        fd_flags | FD_CLOEXEC));
  struct inheritance inherit = {0};
  // spawn is a system call.
  child_pid = spawn(args.argv[0], 0, NULL, &inherit, args.argv, GetEnviron());
  // Restores the current working directory.
  GTEST_DEATH_TEST_CHECK_(fchdir(cwd_fd) != -1);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(cwd_fd));

#  else   // GTEST_OS_QNX
#   if GTEST_OS_LINUX
  // When a SIGPROF signal is received while fork() or clone() are executing,
  // the process may hang. To avoid this, we ignore SIGPROF here and re-enable
  // it after the call to fork()/clone() is complete.
  struct sigaction saved_sigprof_action;
  struct sigaction ignore_sigprof_action;
  memset(&ignore_sigprof_action, 0, sizeof(ignore_sigprof_action));
  sigemptyset(&ignore_sigprof_action.sa_mask);
  ignore_sigprof_action.sa_handler = SIG_IGN;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(sigaction(
      SIGPROF, &ignore_sigprof_action, &saved_sigprof_action));
#   endif  // GTEST_OS_LINUX

#   if GTEST_HAS_CLONE
  const bool use_fork = GTEST_FLAG(death_test_use_fork);

  if (!use_fork) {
    static const bool stack_grows_down = StackGrowsDown();
    const size_t stack_size = getpagesize();
    // MMAP_ANONYMOUS is not defined on Mac, so we use MAP_ANON instead.
    void* const stack = mmap(NULL, stack_size, PROT_READ | PROT_WRITE,
                             MAP_ANON | MAP_PRIVATE, -1, 0);
    GTEST_DEATH_TEST_CHECK_(stack != MAP_FAILED);

    // Maximum stack alignment in bytes:  For a downward-growing stack, this
    // amount is subtracted from size of the stack space to get an address
    // that is within the stack space and is aligned on all systems we care
    // about.  As far as I know there is no ABI with stack alignment greater
    // than 64.  We assume stack and stack_size already have alignment of
    // kMaxStackAlignment.
    const size_t kMaxStackAlignment = 64;
    void* const stack_top =
        static_cast<char*>(stack) +
            (stack_grows_down ? stack_size - kMaxStackAlignment : 0);
    GTEST_DEATH_TEST_CHECK_(stack_size > kMaxStackAlignment &&
        reinterpret_cast<intptr_t>(stack_top) % kMaxStackAlignment == 0);

    child_pid = clone(&ExecDeathTestChildMain, stack_top, SIGCHLD, &args);

    GTEST_DEATH_TEST_CHECK_(munmap(stack, stack_size) != -1);
  }
#   else
  const bool use_fork = true;
#   endif  // GTEST_HAS_CLONE

  if (use_fork && (child_pid = fork()) == 0) {
      ExecDeathTestChildMain(&args);
      _exit(0);
  }
#  endif  // GTEST_OS_QNX
#  if GTEST_OS_LINUX
  GTEST_DEATH_TEST_CHECK_SYSCALL_(
      sigaction(SIGPROF, &saved_sigprof_action, NULL));
#  endif  // GTEST_OS_LINUX

  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  return child_pid;
}